

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O2

bool YAML::Utils::WriteComment(ostream_wrapper *out,string *str,size_t postCommentIndent)

{
  size_t sVar1;
  bool bVar2;
  ostream_wrapper *poVar3;
  pointer pcVar4;
  int codePoint;
  const_iterator i;
  int local_4c;
  Indentation local_48;
  IndentTo local_40;
  const_iterator local_38;
  
  sVar1 = out->m_col;
  poVar3 = YAML::operator<<(out,(char (*) [2])"#");
  local_38._M_current = (char *)postCommentIndent;
  YAML::operator<<(poVar3,(Indentation *)&local_38);
  out->m_comment = true;
  pcVar4 = (str->_M_dataplus)._M_p;
  local_38._M_current = pcVar4;
  while( true ) {
    bVar2 = anon_unknown_0::GetNextCodePointAndAdvance
                      (&local_4c,&local_38,(const_iterator)(pcVar4 + str->_M_string_length));
    if (!bVar2) break;
    if (local_4c == 10) {
      poVar3 = YAML::operator<<(out,(char (*) [2])0x6ecc3e);
      local_40.n = sVar1;
      poVar3 = YAML::operator<<(poVar3,&local_40);
      poVar3 = YAML::operator<<(poVar3,(char (*) [2])"#");
      local_48.n = postCommentIndent;
      YAML::operator<<(poVar3,&local_48);
      out->m_comment = true;
    }
    else {
      anon_unknown_0::WriteCodePoint(out,local_4c);
    }
    pcVar4 = (str->_M_dataplus)._M_p;
  }
  return true;
}

Assistant:

bool WriteComment(ostream_wrapper& out, const std::string& str,
                  std::size_t postCommentIndent) {
  const std::size_t curIndent = out.col();
  out << "#" << Indentation(postCommentIndent);
  out.set_comment();
  int codePoint;
  for (std::string::const_iterator i = str.begin();
       GetNextCodePointAndAdvance(codePoint, i, str.end());) {
    if (codePoint == '\n') {
      out << "\n"
          << IndentTo(curIndent) << "#" << Indentation(postCommentIndent);
      out.set_comment();
    } else {
      WriteCodePoint(out, codePoint);
    }
  }
  return true;
}